

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoinTree.cpp
# Opt level: O0

t_node * __thiscall t_node::operator=(t_node *this,t_node *rhs)

{
  t_node *rhs_local;
  t_node *this_local;
  
  myString::operator=(&this->walletId,&rhs->walletId);
  this->amount = rhs->amount;
  this->left = rhs->left;
  this->right = rhs->right;
  this->transac_ptr = this->right->transac_ptr;
  return this;
}

Assistant:

t_node& t_node::operator=(const t_node &rhs) {
    walletId = rhs.walletId;
    amount = rhs.amount;
    left = rhs.left ;
    right = rhs.right;
    this->transac_ptr = right->transac_ptr;

    return *this;
}